

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_op.hpp
# Opt level: O1

void asio::detail::
     resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:531:13)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  short sVar1;
  short *psVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined8 this;
  int iVar5;
  int *piVar6;
  undefined8 *puVar7;
  OutputWorker *pOVar8;
  in_addr_t iVar9;
  uint uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R13;
  func_type *pp_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__name;
  addrinfo_type *address_info;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  error_code eVar14;
  UDPAddress serverAddress;
  bad_address_cast ex;
  data_union local_278;
  address local_258;
  string local_230;
  undefined1 local_210 [16];
  operation *poStack_200;
  func_type *local_1f8;
  scheduler_operation *local_1f0;
  func_type p_Stack_1e8;
  undefined1 local_1e0 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  auVar13 = in_ZMM1._0_16_;
  local_210._0_8_ = &base[6].task_result_;
  poStack_200 = base;
  local_210._8_8_ = base;
  if ((owner == (void *)0x0) || (base[6].func_ == (func_type)owner)) {
    local_1f8 = *(func_type **)&base[6].task_result_;
    local_210._0_8_ = &local_1f8;
    local_1f0 = base[7].next_;
    p_Stack_1e8 = base[7].func_;
    _local_1e0 = (undefined1  [16])0x0;
    aStack_1d8._8_8_ = 0;
    address_info = *(addrinfo_type **)&base[7].task_result_;
    if (address_info != (addrinfo_type *)0x0) {
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,*(long *)&base[3].task_result_,
                 (long)&(base[4].next_)->next_ + *(long *)&base[3].task_result_);
      unaff_R13 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)unaff_R13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,base[5].next_,base[5].func_ + (long)base[5].next_);
      asio::ip::basic_resolver_results<asio::ip::tcp>::create
                ((basic_resolver_results<asio::ip::tcp> *)&local_258,address_info,
                 (string *)local_1b8,&local_230);
      auVar4 = _local_1e0;
      uVar3 = local_258.ipv6_address_.addr_.__in6_u._0_8_;
      local_1e0._4_4_ = local_258.ipv4_address_.addr_.s_addr;
      local_1e0._0_4_ = local_258.type_;
      auVar13 = (undefined1  [16])0x0;
      local_258.type_ = ipv4;
      local_258.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      local_258.ipv6_address_.addr_.__in6_u._0_8_ =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_1d8._0_8_ = auVar4._8_8_;
      this = aStack_1d8._0_8_;
      aStack_1d8._0_8_ = uVar3;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        auVar13 = (undefined1  [16])0x0;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
      }
      aStack_1d8._8_8_ = local_258.ipv6_address_.addr_.__in6_u._8_8_;
      local_258.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_258.ipv6_address_.addr_.__in6_u._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_258.ipv6_address_.addr_.__in6_u._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != unaff_R13) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    uVar10 = (uint)unaff_R13;
    ptr::reset((ptr *)local_210);
    pp_Var11 = local_1f8;
    if (owner != (void *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(aStack_1d8._0_8_ + 8) = *(_Atomic_word *)(aStack_1d8._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(aStack_1d8._0_8_ + 8) = *(_Atomic_word *)(aStack_1d8._0_8_ + 8) + 1;
        }
      }
      local_1b8._0_8_ = local_1e0;
      local_1b8._8_8_ = aStack_1d8._0_8_;
      local_1a8[0]._M_allocated_capacity = 0;
      bVar12 = local_1e0 != (undefined1  [8])0x0;
      if (bVar12) {
        psVar2 = *(short **)local_1e0;
        sVar1 = *psVar2;
        if (sVar1 != 2) {
          uVar10 = *(uint *)(psVar2 + 0xc);
          auVar13 = *(undefined1 (*) [16])(psVar2 + 4);
          base = (operation *)0x0;
        }
        else {
          base = (operation *)(ulong)*(uint *)(psVar2 + 2);
          auVar13 = (undefined1  [16])0x0;
          uVar10 = 0;
        }
        address_info = (addrinfo_type *)(ulong)(sVar1 != 2);
        if (sVar1 != 2) {
          if (auVar13 != _DAT_00197750) {
            local_230._M_dataplus._M_p = (pointer)&PTR__bad_cast_001bbee8;
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar7 = &PTR__bad_cast_001bbee8;
            __cxa_throw(puVar7,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
          }
          auVar13 = (undefined1  [16])0x0;
          uVar10 = 0;
          base = (operation *)0x100007f;
          address_info = (addrinfo_type *)0x0;
        }
      }
      iVar5 = (int)address_info;
      iVar9 = (in_addr_t)base;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_1c8 = auVar13;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1d8._0_8_);
        auVar13 = local_1c8;
      }
      if (!bVar12) {
        auVar13 = (undefined1  [16])0x0;
        iVar9 = 0;
        uVar10 = 0;
        iVar5 = 0;
      }
      bVar12 = auVar13 == (undefined1  [16])0x0;
      if (iVar5 == 0) {
        bVar12 = iVar9 == 0;
      }
      if (bVar12) {
        if (*(int *)(pp_Var11 + 1) < 5) {
          local_1b8._0_8_ = *pp_Var11;
          local_1b8._8_4_ = 4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[7],(long)pp_Var11[8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,"Unable to resolve server hostname: ",0x23
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[0x5f],
                     (long)pp_Var11[0x60]);
          pOVar8 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::ios_base::~ios_base(local_138);
        }
        LOCK();
        *(undefined4 *)(pp_Var11 + 0x4c) = 3;
        UNLOCK();
      }
      else {
        local_278.v4.sin_port = swap_bytes(*(undefined2 *)(pp_Var11 + 99));
        local_278._16_8_ = 0;
        local_278.v6.sin6_scope_id = 0;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        if (iVar5 == 0) {
          local_278.base.sa_family = 2;
          local_278.v6.sin6_flowinfo = iVar9;
        }
        else {
          local_278.base.sa_family = 10;
          local_278.v6.sin6_flowinfo = 0;
          if (iVar5 != 1) {
            local_1b8._0_8_ = &PTR__bad_cast_001bbee8;
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar7 = &PTR__bad_cast_001bbee8;
            __cxa_throw(puVar7,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
          }
          local_278._12_4_ =
               (uint)auVar13[4] |
               (uint)(((ulong)auVar13[5] << 0x28) >> 0x20) |
               (uint)(((ulong)auVar13[6] << 0x30) >> 0x20) |
               (uint)(((ulong)auVar13[7] << 0x38) >> 0x20);
          local_278._8_4_ =
               (uint)auVar13[0] |
               (uint)auVar13[1] << 8 | (uint)auVar13[2] << 0x10 | (uint)auVar13[3] << 0x18;
          local_278._16_8_ =
               (ulong)auVar13[0] |
               (ulong)auVar13[1] << 8 |
               (ulong)auVar13[2] << 0x10 |
               (ulong)auVar13[3] << 0x18 |
               (ulong)auVar13[4] << 0x20 |
               (ulong)auVar13[5] << 0x28 | (ulong)auVar13[6] << 0x30 | (ulong)auVar13[7] << 0x38;
          local_278.v6.sin6_scope_id = uVar10;
        }
        mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                  ((LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *)(pp_Var11 + 0x77),
                   (basic_endpoint<asio::ip::udp> *)&local_278.base);
        mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                  ((LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *)(pp_Var11 + 0x82),
                   (basic_endpoint<asio::ip::udp> *)&local_278.base);
        if (local_278.base.sa_family != 2) {
          local_258.ipv6_address_.addr_.__in6_u._0_8_ = CONCAT44(local_278._12_4_,local_278._8_4_);
          local_258.ipv6_address_.addr_.__in6_u._8_8_ = local_278._16_8_;
          local_258.ipv6_address_.scope_id_ = (unsigned_long)local_278.v6.sin6_scope_id;
          local_258.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_258.ipv4_address_.addr_.s_addr = local_278.v4.sin_addr.s_addr;
          local_258.ipv6_address_.addr_.__in6_u._0_8_ =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_258.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_258.ipv6_address_.scope_id_ = 0;
        }
        local_258.type_ = (anon_enum_32)(local_278.base.sa_family != 2);
        asio::ip::address::to_string_abi_cxx11_(&local_230,&local_258);
        if (*(int *)(pp_Var11 + 1) < 3) {
          swap_bytes(local_278.v4.sin_port);
          local_1b8._0_8_ = *pp_Var11;
          local_1b8._8_4_ = 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[7],(long)pp_Var11[8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,"Resolved server address to ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,local_230._M_dataplus._M_p,
                     local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf," : ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          pOVar8 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::ios_base::~ios_base(local_138);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1d8._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1d8._0_8_);
    }
  }
  else {
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,*(long *)&base[3].task_result_,
               (long)&(base[4].next_)->next_ + *(long *)&base[3].task_result_);
    uVar3 = local_1b8._0_8_;
    local_1f8 = &p_Stack_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,base[5].next_,base[5].func_ + (long)base[5].next_);
    if ((base[1].func_ == (func_type)0x0) || (*(int *)(base[1].func_ + 8) == 0)) {
      std::error_code::operator=((error_code *)(base + 7),operation_aborted);
    }
    else {
      __name = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)uVar3 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (*(char *)uVar3 != '\0')) {
        __name = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar3;
      }
      pp_Var11 = (func_type *)0x0;
      if ((local_1f8 != (func_type *)0x0) && (*(char *)local_1f8 != '\0')) {
        pp_Var11 = local_1f8;
      }
      piVar6 = __errno_location();
      *piVar6 = 0;
      iVar5 = getaddrinfo(__name->_M_local_buf,(char *)pp_Var11,(addrinfo *)&base[1].task_result_,
                          (addrinfo **)&base[7].task_result_);
      eVar14 = socket_ops::translate_addrinfo_error(iVar5);
      *(int *)&base[7].next_ = eVar14._M_value;
      base[7].func_ = (func_type)eVar14._M_cat;
    }
    if (local_1f8 != &p_Stack_1e8) {
      operator_delete(local_1f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_);
    }
    scheduler::post_deferred_completion((scheduler *)base[6].func_,base);
    stack0xfffffffffffffdf8 = (undefined1  [16])0x0;
  }
  ptr::reset((ptr *)local_210);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the operation object.
    resolve_op* o(static_cast<resolve_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    if (owner && owner != &o->io_context_impl_)
    {
      // The operation is being run on the worker io_context. Time to perform
      // the resolver operation.
    
      // Perform the blocking host resolution operation.
      socket_ops::background_getaddrinfo(o->cancel_token_,
          o->query_.host_name().c_str(), o->query_.service_name().c_str(),
          o->query_.hints(), &o->addrinfo_, o->ec_);

      // Pass operation back to main io_context for completion.
      o->io_context_impl_.post_deferred_completion(o);
      p.v = p.p = 0;
    }
    else
    {
      // The operation has been returned to the main io_context. The completion
      // handler is ready to be delivered.

      ASIO_HANDLER_COMPLETION((*o));

      // Make a copy of the handler so that the memory can be deallocated
      // before the upcall is made. Even if we're not about to make an upcall,
      // a sub-object of the handler may be the true owner of the memory
      // associated with the handler. Consequently, a local copy of the handler
      // is required to ensure that any owning sub-object remains valid until
      // after we have deallocated the memory here.
      detail::binder2<Handler, asio::error_code, results_type>
        handler(o->handler_, o->ec_, results_type());
      p.h = asio::detail::addressof(handler.handler_);
      if (o->addrinfo_)
      {
        handler.arg2_ = results_type::create(o->addrinfo_,
            o->query_.host_name(), o->query_.service_name());
      }
      p.reset();

      if (owner)
      {
        fenced_block b(fenced_block::half);
        ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, "..."));
        w.complete(handler, handler.handler_);
        ASIO_HANDLER_INVOCATION_END;
      }
    }
  }